

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

SVInt __thiscall slang::SVInt::resize(SVInt *this,bitwidth_t bits)

{
  uint uVar1;
  uint in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined4 in_register_00000034;
  double in_XMM0_Qa;
  SVInt SVar3;
  undefined8 uVar2;
  
  uVar1 = *(uint *)(CONCAT44(in_register_00000034,bits) + 8);
  if (in_EDX < uVar1) {
    trunc(this,in_XMM0_Qa);
    uVar2 = extraout_RDX;
  }
  else if (uVar1 < in_EDX) {
    if (*(char *)(CONCAT44(in_register_00000034,bits) + 0xc) == '\x01') {
      SVar3 = sext(this,bits);
      uVar2 = SVar3.super_SVIntStorage._8_8_;
    }
    else {
      SVar3 = zext(this,bits);
      uVar2 = SVar3.super_SVIntStorage._8_8_;
    }
  }
  else {
    SVInt(this,(SVIntStorage *)CONCAT44(in_register_00000034,bits));
    uVar2 = extraout_RDX_00;
  }
  SVar3.super_SVIntStorage.bitWidth = (int)uVar2;
  SVar3.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar2 >> 0x20);
  SVar3.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar2 >> 0x28);
  SVar3.super_SVIntStorage._14_2_ = (short)((ulong)uVar2 >> 0x30);
  SVar3.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar3.super_SVIntStorage;
}

Assistant:

SVInt SVInt::resize(bitwidth_t bits) const {
    if (bits < bitWidth)
        return trunc(bits);
    if (bits > bitWidth)
        return extend(bits, signFlag);
    return *this;
}